

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  short sVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  parasail_result_t *ppVar19;
  __m128i *palVar20;
  __m128i *b;
  __m128i *palVar21;
  __m128i *palVar22;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *palVar23;
  __m128i *ptr_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  int16_t *ptr_01;
  __m128i *ptr_02;
  int16_t iVar24;
  size_t len;
  char *pcVar25;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  long lVar26;
  long lVar27;
  long lVar28;
  char *__format;
  int iVar29;
  ulong uVar30;
  __m128i *ptr_03;
  long lVar31;
  __m128i *ptr_04;
  long lVar32;
  ulong size;
  int iVar33;
  undefined4 uVar35;
  undefined4 uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  ushort uVar49;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ushort uVar61;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  __m128i alVar54;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  __m128i alVar67;
  ushort uVar68;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar76;
  ushort uVar78;
  ushort uVar80;
  undefined1 auVar69 [16];
  __m128i alVar70;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar82 [16];
  short sVar87;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  undefined1 auVar88 [16];
  ulong uVar96;
  undefined1 auVar97 [16];
  ulong uVar98;
  short sVar99;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  undefined1 auVar100 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i *local_190;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_138 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  ushort local_e8;
  ushort uStack_e6;
  short local_78;
  short sStack_76;
  __m128i_16_t e;
  __m128i_16_t h;
  longlong extraout_RDX;
  short sVar34;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  ushort uVar75;
  ushort uVar77;
  ushort uVar79;
  ushort uVar81;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar25 = "profile";
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar25 = "profile->profile16.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar25 = "profile->matrix";
      }
      else {
        uVar18 = profile->s1Len;
        if ((int)uVar18 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar25 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar25 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "open";
        }
        else {
          if (-1 < gap) {
            uVar16 = uVar18 - 1;
            size = (ulong)uVar18 + 7 >> 3;
            uVar37 = (ulong)uVar16 % size;
            pvVar5 = (profile->profile16).matches;
            pvVar6 = (profile->profile16).similar;
            uVar30 = (ulong)(uint)open;
            iVar33 = -open;
            iVar29 = ppVar4->min;
            iVar7 = -iVar29;
            if (iVar29 != iVar33 && SBORROW4(iVar29,iVar33) == iVar29 + open < 0) {
              iVar7 = open;
            }
            iVar14 = ppVar4->max;
            ppVar19 = parasail_result_new_stats();
            if (ppVar19 != (parasail_result_t *)0x0) {
              ppVar19->flag = ppVar19->flag | 0x8210801;
              local_190 = parasail_memalign___m128i(0x10,size);
              palVar20 = parasail_memalign___m128i(0x10,size);
              b = parasail_memalign___m128i(0x10,size);
              palVar21 = parasail_memalign___m128i(0x10,size);
              palVar22 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              palVar23 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              len = CONCAT71((int7)(uVar30 >> 8),ptr_00 == (__m128i *)0x0);
              c[1]._1_7_ = (undefined7)((ulong)b_01 >> 8);
              c[1]._0_1_ = b_02 == (__m128i *)0x0;
              auVar38._0_8_ = -(ulong)(local_190 == (__m128i *)0x0);
              auVar38._8_8_ = -(ulong)(palVar20 == (__m128i *)0x0);
              auVar62._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar62._8_8_ = -(ulong)(palVar21 == (__m128i *)0x0);
              auVar38 = packssdw(auVar38,auVar62);
              auVar109._0_8_ = -(ulong)(palVar22 == (__m128i *)0x0);
              auVar109._8_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar112._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar112._8_8_ = -(ulong)(palVar23 == (__m128i *)0x0);
              auVar62 = packssdw(auVar109,auVar112);
              auVar38 = packssdw(auVar38,auVar62);
              if (((((b_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) && b_02 != (__m128i *)0x0)
                   && b_03 != (__m128i *)0x0) && ptr_01 != (int16_t *)0x0) &&
                  ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar38 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar38 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar38 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar38 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar38 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar38 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar38 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar38 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar38 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar38 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar38 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar38 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar38[0xf])) {
                iVar17 = s2Len + -1;
                auVar38 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar35 = auVar38._0_4_;
                auVar38 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar36 = auVar38._0_4_;
                auVar38 = pshuflw(ZEXT416(iVar7 - 0x7fff),ZEXT416(iVar7 - 0x7fff),0);
                local_e8 = auVar38._0_2_;
                uStack_e6 = auVar38._2_2_;
                auVar62 = ZEXT416(CONCAT22((short)((uint)iVar29 >> 0x10),0x7ffe - (short)iVar14));
                auVar62 = pshuflw(auVar62,auVar62,0);
                local_78 = auVar62._0_2_;
                sStack_76 = auVar62._2_2_;
                c[0] = size;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX;
                c_00[0] = size;
                parasail_memset___m128i(palVar22,c_00,len);
                c_01[1] = extraout_RDX_00;
                c_01[0] = size;
                parasail_memset___m128i(b_00,c_01,len);
                c_02[1] = extraout_RDX_01;
                c_02[0] = size;
                parasail_memset___m128i(b_01,c_02,len);
                c_03[1] = extraout_RDX_02;
                c_03[0] = size;
                parasail_memset___m128i(b_02,c_03,len);
                c_04[1] = extraout_RDX_03;
                c_04[0] = size;
                parasail_memset___m128i(b_03,c_04,len);
                lVar26 = (long)iVar33;
                for (uVar30 = 0; uVar30 != size; uVar30 = uVar30 + 1) {
                  lVar31 = lVar26;
                  for (lVar32 = 0; lVar32 != 8; lVar32 = lVar32 + 1) {
                    lVar27 = -0x8000;
                    if (-0x8000 < lVar31) {
                      lVar27 = lVar31;
                    }
                    lVar28 = lVar31 - (ulong)(uint)open;
                    if (lVar28 < -0x7fff) {
                      lVar28 = -0x8000;
                    }
                    *(short *)((long)&h + lVar32 * 2) = (short)lVar27;
                    *(short *)((long)&e + lVar32 * 2) = (short)lVar28;
                    lVar31 = lVar31 - size * (uint)gap;
                  }
                  local_190[uVar30][0] = h.m[0];
                  local_190[uVar30][1] = h.m[1];
                  ptr_00[uVar30][0] = e.m[0];
                  ptr_00[uVar30][1] = e.m[1];
                  lVar26 = lVar26 - (ulong)(uint)gap;
                }
                *ptr_01 = 0;
                for (uVar30 = 1; s2Len + 1 != uVar30; uVar30 = uVar30 + 1) {
                  iVar24 = -0x8000;
                  if (-0x8000 < iVar33) {
                    iVar24 = (int16_t)iVar33;
                  }
                  ptr_01[uVar30] = iVar24;
                  iVar33 = iVar33 - gap;
                }
                uVar18 = (int)size - 1;
                uVar30 = 0;
                local_168 = CONCAT26(sStack_76,CONCAT24(local_78,auVar62._0_4_));
                uStack_160 = CONCAT26(sStack_76,CONCAT24(local_78,auVar62._0_4_));
                uVar49 = local_e8;
                uVar55 = uStack_e6;
                uVar56 = local_e8;
                uVar57 = uStack_e6;
                uVar58 = local_e8;
                uVar59 = uStack_e6;
                uVar60 = local_e8;
                uVar61 = uStack_e6;
                do {
                  ptr_04 = palVar22;
                  ptr_03 = palVar23;
                  palVar22 = palVar21;
                  ptr_02 = palVar20;
                  if (uVar30 == (uint)s2Len) {
                    alVar70 = local_190[uVar37];
                    alVar67 = b[uVar37];
                    alVar54 = ptr_04[uVar37];
                    alVar41 = b_00[uVar37];
                    iVar29 = 0;
                    while( true ) {
                      uVar96 = alVar70[0];
                      lVar27 = alVar70[1];
                      uVar98 = alVar67[0];
                      lVar32 = alVar67[1];
                      uVar30 = alVar54[0];
                      lVar31 = alVar54[1];
                      uVar37 = alVar41[0];
                      lVar26 = alVar41[1];
                      if (7 - (int)(uVar16 / size) <= iVar29) break;
                      alVar70[0] = uVar96 << 0x10;
                      alVar70[1] = lVar27 << 0x10 | uVar96 >> 0x30;
                      alVar67[0] = uVar98 << 0x10;
                      alVar67[1] = lVar32 << 0x10 | uVar98 >> 0x30;
                      alVar54[0] = uVar30 << 0x10;
                      alVar54[1] = lVar31 << 0x10 | uVar30 >> 0x30;
                      alVar41[0] = uVar37 << 0x10;
                      alVar41[1] = lVar26 << 0x10 | uVar37 >> 0x30;
                      iVar29 = iVar29 + 1;
                    }
                    auVar88._0_2_ = -(ushort)((short)local_168 < (short)local_e8);
                    auVar88._2_2_ = -(ushort)(local_168._2_2_ < (short)uStack_e6);
                    auVar88._4_2_ = -(ushort)(local_168._4_2_ < (short)local_e8);
                    auVar88._6_2_ = -(ushort)(local_168._6_2_ < (short)uStack_e6);
                    auVar88._8_2_ = -(ushort)((short)uStack_160 < (short)local_e8);
                    auVar88._10_2_ = -(ushort)(uStack_160._2_2_ < (short)uStack_e6);
                    auVar88._12_2_ = -(ushort)(uStack_160._4_2_ < (short)local_e8);
                    auVar88._14_2_ = -(ushort)(uStack_160._6_2_ < (short)uStack_e6);
                    auVar82._0_2_ = -(ushort)(local_78 < (short)uVar49);
                    auVar82._2_2_ = -(ushort)(sStack_76 < (short)uVar55);
                    auVar82._4_2_ = -(ushort)(local_78 < (short)uVar56);
                    auVar82._6_2_ = -(ushort)(sStack_76 < (short)uVar57);
                    auVar82._8_2_ = -(ushort)(local_78 < (short)uVar58);
                    auVar82._10_2_ = -(ushort)(sStack_76 < (short)uVar59);
                    auVar82._12_2_ = -(ushort)(local_78 < (short)uVar60);
                    auVar82._14_2_ = -(ushort)(sStack_76 < (short)uVar61);
                    auVar82 = auVar82 | auVar88;
                    if ((((((((((((((((auVar82 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar82 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar82 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar82 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar82 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar82 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar82 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar82 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar82 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar82 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar82 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar82 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar82 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar82 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar82[0xf]) {
                      sVar15 = alVar70[1]._6_2_;
                      sVar34 = alVar67[1]._6_2_;
                      sVar42 = alVar54[1]._6_2_;
                      sVar43 = alVar41[1]._6_2_;
                    }
                    else {
                      *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                      sVar15 = 0;
                      sVar34 = 0;
                      sVar42 = 0;
                      sVar43 = 0;
                      iVar17 = 0;
                      uVar16 = 0;
                    }
                    ppVar19->score = (int)sVar15;
                    ppVar19->end_query = uVar16;
                    ppVar19->end_ref = iVar17;
                    *(int *)(ppVar19->field_4).extra = (int)sVar34;
                    ((ppVar19->field_4).stats)->similar = (int)sVar42;
                    ((ppVar19->field_4).stats)->length = (int)sVar43;
                    parasail_free(ptr_01);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_03);
                    parasail_free(b_00);
                    parasail_free(ptr);
                    parasail_free(ptr_04);
                    parasail_free(palVar22);
                    parasail_free(b);
                    parasail_free(ptr_02);
                    parasail_free(local_190);
                    return ppVar19;
                  }
                  uVar98 = local_190[uVar18][0];
                  uVar96 = b[uVar18][0];
                  uVar9 = ptr_04[uVar18][0];
                  uVar10 = b_00[uVar18][0];
                  auVar110._0_8_ = uVar96 << 0x10;
                  auVar110._8_8_ = b[uVar18][1] << 0x10 | uVar96 >> 0x30;
                  auVar108._0_8_ = uVar9 << 0x10;
                  auVar108._8_8_ = ptr_04[uVar18][1] << 0x10 | uVar9 >> 0x30;
                  auVar63._0_8_ = uVar10 << 0x10;
                  auVar63._8_8_ = b_00[uVar18][1] << 0x10 | uVar10 >> 0x30;
                  auVar50._8_8_ = local_190[uVar18][1] << 0x10 | uVar98 >> 0x30;
                  auVar50._0_8_ = uVar98 << 0x10 | (ulong)(ushort)ptr_01[uVar30];
                  lVar31 = (long)(ppVar4->mapper[(byte)s2[uVar30]] * (int)size) * 0x10;
                  local_f8 = (undefined1  [16])0x0;
                  auVar100._4_2_ = local_e8;
                  auVar100._0_4_ = auVar38._0_4_;
                  auVar100._6_2_ = uStack_e6;
                  auVar100._8_2_ = local_e8;
                  auVar100._10_2_ = uStack_e6;
                  auVar100._12_2_ = local_e8;
                  auVar100._14_2_ = uStack_e6;
                  local_138 = (undefined1  [16])0x0;
                  local_108._8_8_ = 0x1000100010001;
                  local_108._0_8_ = 0x1000100010001;
                  for (lVar26 = 0; size << 4 != lVar26; lVar26 = lVar26 + 0x10) {
                    auVar62 = *(undefined1 (*) [16])((long)*ptr_00 + lVar26);
                    auVar109 = *(undefined1 (*) [16])((long)*b_01 + lVar26);
                    auVar112 = *(undefined1 (*) [16])((long)*b_02 + lVar26);
                    auVar65 = *(undefined1 (*) [16])((long)*b_03 + lVar26);
                    auVar50 = paddsw(auVar50,*(undefined1 (*) [16])((long)pvVar3 + lVar26 + lVar31))
                    ;
                    sVar15 = auVar62._0_2_;
                    uVar83 = auVar50._0_2_;
                    uVar68 = (ushort)((short)uVar83 < sVar15) * sVar15 |
                             ((short)uVar83 >= sVar15) * uVar83;
                    sVar15 = auVar62._2_2_;
                    uVar84 = auVar50._2_2_;
                    uVar71 = (ushort)((short)uVar84 < sVar15) * sVar15 |
                             ((short)uVar84 >= sVar15) * uVar84;
                    sVar15 = auVar62._4_2_;
                    uVar85 = auVar50._4_2_;
                    uVar72 = (ushort)((short)uVar85 < sVar15) * sVar15 |
                             ((short)uVar85 >= sVar15) * uVar85;
                    sVar15 = auVar62._6_2_;
                    uVar86 = auVar50._6_2_;
                    uVar73 = (ushort)((short)uVar86 < sVar15) * sVar15 |
                             ((short)uVar86 >= sVar15) * uVar86;
                    sVar15 = auVar62._8_2_;
                    uVar75 = auVar50._8_2_;
                    uVar74 = (ushort)((short)uVar75 < sVar15) * sVar15 |
                             ((short)uVar75 >= sVar15) * uVar75;
                    sVar15 = auVar62._10_2_;
                    uVar77 = auVar50._10_2_;
                    uVar76 = (ushort)((short)uVar77 < sVar15) * sVar15 |
                             ((short)uVar77 >= sVar15) * uVar77;
                    sVar15 = auVar62._12_2_;
                    uVar79 = auVar50._12_2_;
                    uVar81 = auVar50._14_2_;
                    uVar78 = (ushort)((short)uVar79 < sVar15) * sVar15 |
                             ((short)uVar79 >= sVar15) * uVar79;
                    sVar15 = auVar62._14_2_;
                    uVar80 = (ushort)((short)uVar81 < sVar15) * sVar15 |
                             ((short)uVar81 >= sVar15) * uVar81;
                    sVar15 = auVar100._0_2_;
                    auVar64._0_2_ =
                         (ushort)((short)uVar68 < sVar15) * sVar15 |
                         ((short)uVar68 >= sVar15) * uVar68;
                    sVar34 = auVar100._2_2_;
                    auVar64._2_2_ =
                         (ushort)((short)uVar71 < sVar34) * sVar34 |
                         ((short)uVar71 >= sVar34) * uVar71;
                    sVar42 = auVar100._4_2_;
                    auVar64._4_2_ =
                         (ushort)((short)uVar72 < sVar42) * sVar42 |
                         ((short)uVar72 >= sVar42) * uVar72;
                    sVar43 = auVar100._6_2_;
                    auVar64._6_2_ =
                         (ushort)((short)uVar73 < sVar43) * sVar43 |
                         ((short)uVar73 >= sVar43) * uVar73;
                    sVar44 = auVar100._8_2_;
                    auVar64._8_2_ =
                         (ushort)((short)uVar74 < sVar44) * sVar44 |
                         ((short)uVar74 >= sVar44) * uVar74;
                    sVar45 = auVar100._10_2_;
                    auVar64._10_2_ =
                         (ushort)((short)uVar76 < sVar45) * sVar45 |
                         ((short)uVar76 >= sVar45) * uVar76;
                    sVar46 = auVar100._12_2_;
                    auVar64._12_2_ =
                         (ushort)((short)uVar78 < sVar46) * sVar46 |
                         ((short)uVar78 >= sVar46) * uVar78;
                    sVar47 = auVar100._14_2_;
                    auVar64._14_2_ =
                         (ushort)((short)uVar80 < sVar47) * sVar47 |
                         ((short)uVar80 >= sVar47) * uVar80;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar26) = auVar64;
                    auVar69._0_2_ = -(ushort)(sVar15 < (short)uVar68);
                    auVar69._2_2_ = -(ushort)(sVar34 < (short)uVar71);
                    auVar69._4_2_ = -(ushort)(sVar42 < (short)uVar72);
                    auVar69._6_2_ = -(ushort)(sVar43 < (short)uVar73);
                    auVar69._8_2_ = -(ushort)(sVar44 < (short)uVar74);
                    auVar69._10_2_ = -(ushort)(sVar45 < (short)uVar76);
                    auVar69._12_2_ = -(ushort)(sVar46 < (short)uVar78);
                    auVar69._14_2_ = -(ushort)(sVar47 < (short)uVar80);
                    auVar50 = pblendvb(local_f8,auVar109,auVar69);
                    auVar110 = paddsw(auVar110,*(undefined1 (*) [16])
                                                ((long)pvVar5 + lVar26 + lVar31));
                    auVar51._0_2_ = -(ushort)(uVar83 == auVar64._0_2_);
                    auVar51._2_2_ = -(ushort)(uVar84 == auVar64._2_2_);
                    auVar51._4_2_ = -(ushort)(uVar85 == auVar64._4_2_);
                    auVar51._6_2_ = -(ushort)(uVar86 == auVar64._6_2_);
                    auVar51._8_2_ = -(ushort)(uVar75 == auVar64._8_2_);
                    auVar51._10_2_ = -(ushort)(uVar77 == auVar64._10_2_);
                    auVar51._12_2_ = -(ushort)(uVar79 == auVar64._12_2_);
                    auVar51._14_2_ = -(ushort)(uVar81 == auVar64._14_2_);
                    auVar97 = pblendvb(auVar50,auVar110,auVar51);
                    *(undefined1 (*) [16])((long)*palVar22 + lVar26) = auVar97;
                    auVar110 = pblendvb(local_138,auVar112,auVar69);
                    auVar50 = paddsw(auVar108,*(undefined1 (*) [16])((long)pvVar6 + lVar26 + lVar31)
                                    );
                    auVar111 = pblendvb(auVar110,auVar50,auVar51);
                    *(undefined1 (*) [16])((long)*ptr + lVar26) = auVar111;
                    auVar108 = pblendvb(local_108,auVar65,auVar69);
                    auVar50 = pmovsxbw(auVar69,0x101010101010101);
                    auVar110 = paddsw(auVar63,auVar50);
                    auVar108 = pblendvb(auVar108,auVar110,auVar51);
                    *(undefined1 (*) [16])((long)*ptr_03 + lVar26) = auVar108;
                    local_168._0_4_ =
                         CONCAT22(((short)auVar64._2_2_ < local_168._2_2_) * auVar64._2_2_ |
                                  (ushort)((short)auVar64._2_2_ >= local_168._2_2_) *
                                  local_168._2_2_,
                                  ((short)auVar64._0_2_ < (short)local_168) * auVar64._0_2_ |
                                  (ushort)((short)auVar64._0_2_ >= (short)local_168) *
                                  (short)local_168);
                    local_168._0_6_ =
                         CONCAT24(((short)auVar64._4_2_ < local_168._4_2_) * auVar64._4_2_ |
                                  (ushort)((short)auVar64._4_2_ >= local_168._4_2_) *
                                  local_168._4_2_,(undefined4)local_168);
                    local_168 = CONCAT26(((short)auVar64._6_2_ < local_168._6_2_) * auVar64._6_2_ |
                                         (ushort)((short)auVar64._6_2_ >= local_168._6_2_) *
                                         local_168._6_2_,(undefined6)local_168);
                    uStack_160._0_4_ =
                         CONCAT22(((short)auVar64._10_2_ < uStack_160._2_2_) * auVar64._10_2_ |
                                  (ushort)((short)auVar64._10_2_ >= uStack_160._2_2_) *
                                  uStack_160._2_2_,
                                  ((short)auVar64._8_2_ < (short)uStack_160) * auVar64._8_2_ |
                                  (ushort)((short)auVar64._8_2_ >= (short)uStack_160) *
                                  (short)uStack_160);
                    uStack_160._0_6_ =
                         CONCAT24(((short)auVar64._12_2_ < uStack_160._4_2_) * auVar64._12_2_ |
                                  (ushort)((short)auVar64._12_2_ >= uStack_160._4_2_) *
                                  uStack_160._4_2_,(undefined4)uStack_160);
                    uStack_160 = CONCAT26(((short)auVar64._14_2_ < uStack_160._6_2_) *
                                          auVar64._14_2_ |
                                          (ushort)((short)auVar64._14_2_ >= uStack_160._6_2_) *
                                          uStack_160._6_2_,(undefined6)uStack_160);
                    uVar68 = ((short)uVar49 < (short)auVar64._0_2_) * auVar64._0_2_ |
                             ((short)uVar49 >= (short)auVar64._0_2_) * uVar49;
                    uVar83 = ((short)uVar55 < (short)auVar64._2_2_) * auVar64._2_2_ |
                             ((short)uVar55 >= (short)auVar64._2_2_) * uVar55;
                    uVar71 = ((short)uVar56 < (short)auVar64._4_2_) * auVar64._4_2_ |
                             ((short)uVar56 >= (short)auVar64._4_2_) * uVar56;
                    uVar84 = ((short)uVar57 < (short)auVar64._6_2_) * auVar64._6_2_ |
                             ((short)uVar57 >= (short)auVar64._6_2_) * uVar57;
                    uVar72 = ((short)uVar58 < (short)auVar64._8_2_) * auVar64._8_2_ |
                             ((short)uVar58 >= (short)auVar64._8_2_) * uVar58;
                    uVar85 = ((short)uVar59 < (short)auVar64._10_2_) * auVar64._10_2_ |
                             ((short)uVar59 >= (short)auVar64._10_2_) * uVar59;
                    uVar86 = ((short)uVar60 < (short)auVar64._12_2_) * auVar64._12_2_ |
                             ((short)uVar60 >= (short)auVar64._12_2_) * uVar60;
                    uVar73 = ((short)uVar61 < (short)auVar64._14_2_) * auVar64._14_2_ |
                             ((short)uVar61 >= (short)auVar64._14_2_) * uVar61;
                    sVar15 = auVar108._0_2_;
                    sVar34 = auVar111._0_2_;
                    uVar49 = (ushort)(sVar34 < sVar15) * sVar15 |
                             (ushort)(sVar34 >= sVar15) * sVar34;
                    sVar15 = auVar108._2_2_;
                    sVar34 = auVar111._2_2_;
                    uVar55 = (ushort)(sVar34 < sVar15) * sVar15 |
                             (ushort)(sVar34 >= sVar15) * sVar34;
                    sVar15 = auVar108._4_2_;
                    sVar34 = auVar111._4_2_;
                    uVar56 = (ushort)(sVar34 < sVar15) * sVar15 |
                             (ushort)(sVar34 >= sVar15) * sVar34;
                    sVar15 = auVar108._6_2_;
                    sVar34 = auVar111._6_2_;
                    uVar57 = (ushort)(sVar34 < sVar15) * sVar15 |
                             (ushort)(sVar34 >= sVar15) * sVar34;
                    sVar15 = auVar108._8_2_;
                    sVar34 = auVar111._8_2_;
                    uVar58 = (ushort)(sVar34 < sVar15) * sVar15 |
                             (ushort)(sVar34 >= sVar15) * sVar34;
                    sVar15 = auVar108._10_2_;
                    sVar34 = auVar111._10_2_;
                    uVar59 = (ushort)(sVar34 < sVar15) * sVar15 |
                             (ushort)(sVar34 >= sVar15) * sVar34;
                    sVar15 = auVar108._12_2_;
                    sVar34 = auVar111._12_2_;
                    sVar42 = auVar111._14_2_;
                    uVar60 = (ushort)(sVar34 < sVar15) * sVar15 |
                             (ushort)(sVar34 >= sVar15) * sVar34;
                    sVar15 = auVar108._14_2_;
                    uVar61 = (ushort)(sVar42 < sVar15) * sVar15 |
                             (ushort)(sVar42 >= sVar15) * sVar42;
                    auVar11._4_4_ = uVar35;
                    auVar11._0_4_ = uVar35;
                    auVar11._8_4_ = uVar35;
                    auVar11._12_4_ = uVar35;
                    auVar110 = psubsw(auVar64,auVar11);
                    auVar12._4_4_ = uVar36;
                    auVar12._0_4_ = uVar36;
                    auVar12._8_4_ = uVar36;
                    auVar12._12_4_ = uVar36;
                    auVar62 = psubsw(auVar62,auVar12);
                    sVar34 = auVar110._0_2_;
                    sVar87 = auVar62._0_2_;
                    auVar39._0_2_ = -(ushort)(sVar87 < sVar34);
                    sVar42 = auVar110._2_2_;
                    sVar89 = auVar62._2_2_;
                    auVar39._2_2_ = -(ushort)(sVar89 < sVar42);
                    sVar43 = auVar110._4_2_;
                    sVar90 = auVar62._4_2_;
                    auVar39._4_2_ = -(ushort)(sVar90 < sVar43);
                    sVar44 = auVar110._6_2_;
                    sVar91 = auVar62._6_2_;
                    auVar39._6_2_ = -(ushort)(sVar91 < sVar44);
                    sVar45 = auVar110._8_2_;
                    sVar92 = auVar62._8_2_;
                    auVar39._8_2_ = -(ushort)(sVar92 < sVar45);
                    sVar46 = auVar110._10_2_;
                    sVar93 = auVar62._10_2_;
                    auVar39._10_2_ = -(ushort)(sVar93 < sVar46);
                    sVar47 = auVar110._12_2_;
                    sVar94 = auVar62._12_2_;
                    sVar48 = auVar110._14_2_;
                    auVar39._12_2_ = -(ushort)(sVar94 < sVar47);
                    sVar95 = auVar62._14_2_;
                    auVar39._14_2_ = -(ushort)(sVar95 < sVar48);
                    auVar110 = pblendvb(auVar109,auVar97,auVar39);
                    auVar112 = pblendvb(auVar112,auVar111,auVar39);
                    auVar62 = paddsw(auVar65,auVar50);
                    auVar109 = paddsw(auVar108,auVar50);
                    auVar50 = pblendvb(auVar62,auVar109,auVar39);
                    auVar62 = psubsw(auVar100,auVar12);
                    sVar99 = auVar62._0_2_;
                    auVar65._0_2_ = -(ushort)(sVar99 < sVar34);
                    sVar101 = auVar62._2_2_;
                    auVar65._2_2_ = -(ushort)(sVar101 < sVar42);
                    sVar102 = auVar62._4_2_;
                    auVar65._4_2_ = -(ushort)(sVar102 < sVar43);
                    sVar103 = auVar62._6_2_;
                    auVar65._6_2_ = -(ushort)(sVar103 < sVar44);
                    sVar104 = auVar62._8_2_;
                    auVar65._8_2_ = -(ushort)(sVar104 < sVar45);
                    sVar105 = auVar62._10_2_;
                    auVar65._10_2_ = -(ushort)(sVar105 < sVar46);
                    sVar106 = auVar62._12_2_;
                    auVar65._12_2_ = -(ushort)(sVar106 < sVar47);
                    sVar107 = auVar62._14_2_;
                    auVar65._14_2_ = -(ushort)(sVar107 < sVar48);
                    local_f8 = pblendvb(local_f8,auVar97,auVar65);
                    sVar15 = auVar97._0_2_;
                    uVar68 = (ushort)((short)uVar68 < sVar15) * sVar15 |
                             ((short)uVar68 >= sVar15) * uVar68;
                    sVar15 = auVar97._2_2_;
                    uVar83 = (ushort)((short)uVar83 < sVar15) * sVar15 |
                             ((short)uVar83 >= sVar15) * uVar83;
                    sVar15 = auVar97._4_2_;
                    uVar71 = (ushort)((short)uVar71 < sVar15) * sVar15 |
                             ((short)uVar71 >= sVar15) * uVar71;
                    sVar15 = auVar97._6_2_;
                    uVar84 = (ushort)((short)uVar84 < sVar15) * sVar15 |
                             ((short)uVar84 >= sVar15) * uVar84;
                    sVar15 = auVar97._8_2_;
                    uVar72 = (ushort)((short)uVar72 < sVar15) * sVar15 |
                             ((short)uVar72 >= sVar15) * uVar72;
                    sVar15 = auVar97._10_2_;
                    uVar85 = (ushort)((short)uVar85 < sVar15) * sVar15 |
                             ((short)uVar85 >= sVar15) * uVar85;
                    sVar15 = auVar97._12_2_;
                    uVar86 = (ushort)((short)uVar86 < sVar15) * sVar15 |
                             ((short)uVar86 >= sVar15) * uVar86;
                    sVar15 = auVar97._14_2_;
                    uVar73 = (ushort)((short)uVar73 < sVar15) * sVar15 |
                             ((short)uVar73 >= sVar15) * uVar73;
                    uVar49 = ((short)uVar68 < (short)uVar49) * uVar49 |
                             ((short)uVar68 >= (short)uVar49) * uVar68;
                    uVar55 = ((short)uVar83 < (short)uVar55) * uVar55 |
                             ((short)uVar83 >= (short)uVar55) * uVar83;
                    uVar56 = ((short)uVar71 < (short)uVar56) * uVar56 |
                             ((short)uVar71 >= (short)uVar56) * uVar71;
                    uVar57 = ((short)uVar84 < (short)uVar57) * uVar57 |
                             ((short)uVar84 >= (short)uVar57) * uVar84;
                    uVar58 = ((short)uVar72 < (short)uVar58) * uVar58 |
                             ((short)uVar72 >= (short)uVar58) * uVar72;
                    uVar59 = ((short)uVar85 < (short)uVar59) * uVar59 |
                             ((short)uVar85 >= (short)uVar59) * uVar85;
                    uVar60 = ((short)uVar86 < (short)uVar60) * uVar60 |
                             ((short)uVar86 >= (short)uVar60) * uVar86;
                    uVar61 = ((short)uVar73 < (short)uVar61) * uVar61 |
                             ((short)uVar73 >= (short)uVar61) * uVar73;
                    puVar1 = (ushort *)((long)*ptr_00 + lVar26);
                    *puVar1 = (ushort)(sVar34 < sVar87) * sVar87 |
                              (ushort)(sVar34 >= sVar87) * sVar34;
                    puVar1[1] = (ushort)(sVar42 < sVar89) * sVar89 |
                                (ushort)(sVar42 >= sVar89) * sVar42;
                    puVar1[2] = (ushort)(sVar43 < sVar90) * sVar90 |
                                (ushort)(sVar43 >= sVar90) * sVar43;
                    puVar1[3] = (ushort)(sVar44 < sVar91) * sVar91 |
                                (ushort)(sVar44 >= sVar91) * sVar44;
                    puVar1[4] = (ushort)(sVar45 < sVar92) * sVar92 |
                                (ushort)(sVar45 >= sVar92) * sVar45;
                    puVar1[5] = (ushort)(sVar46 < sVar93) * sVar93 |
                                (ushort)(sVar46 >= sVar93) * sVar46;
                    puVar1[6] = (ushort)(sVar47 < sVar94) * sVar94 |
                                (ushort)(sVar47 >= sVar94) * sVar47;
                    puVar1[7] = (ushort)(sVar48 < sVar95) * sVar95 |
                                (ushort)(sVar48 >= sVar95) * sVar48;
                    *(undefined1 (*) [16])((long)*b_01 + lVar26) = auVar110;
                    *(undefined1 (*) [16])((long)*b_02 + lVar26) = auVar112;
                    *(undefined1 (*) [16])((long)*b_03 + lVar26) = auVar50;
                    auVar100._0_2_ =
                         (ushort)(sVar34 < sVar99) * sVar99 | (ushort)(sVar34 >= sVar99) * sVar34;
                    auVar100._2_2_ =
                         (ushort)(sVar42 < sVar101) * sVar101 | (ushort)(sVar42 >= sVar101) * sVar42
                    ;
                    auVar100._4_2_ =
                         (ushort)(sVar43 < sVar102) * sVar102 | (ushort)(sVar43 >= sVar102) * sVar43
                    ;
                    auVar100._6_2_ =
                         (ushort)(sVar44 < sVar103) * sVar103 | (ushort)(sVar44 >= sVar103) * sVar44
                    ;
                    auVar100._8_2_ =
                         (ushort)(sVar45 < sVar104) * sVar104 | (ushort)(sVar45 >= sVar104) * sVar45
                    ;
                    auVar100._10_2_ =
                         (ushort)(sVar46 < sVar105) * sVar105 | (ushort)(sVar46 >= sVar105) * sVar46
                    ;
                    auVar100._12_2_ =
                         (ushort)(sVar47 < sVar106) * sVar106 | (ushort)(sVar47 >= sVar106) * sVar47
                    ;
                    auVar100._14_2_ =
                         (ushort)(sVar48 < sVar107) * sVar107 | (ushort)(sVar48 >= sVar107) * sVar48
                    ;
                    local_138 = pblendvb(local_138,auVar111,auVar65);
                    auVar62 = paddsw(local_108,_DAT_008a1ba0);
                    local_108 = pblendvb(auVar62,auVar109,auVar65);
                    auVar50 = *(undefined1 (*) [16])((long)*local_190 + lVar26);
                    auVar110 = *(undefined1 (*) [16])((long)*b + lVar26);
                    auVar108 = *(undefined1 (*) [16])((long)*ptr_04 + lVar26);
                    auVar63 = *(undefined1 (*) [16])((long)*b_00 + lVar26);
                  }
                  for (iVar29 = 0; iVar29 != 8; iVar29 = iVar29 + 1) {
                    uVar98 = local_190[uVar18][0];
                    uVar8 = ptr_01[uVar30 + 1] - open;
                    if (ptr_01[uVar30 + 1] - open < -0x7fff) {
                      uVar8 = 0xffff8000;
                    }
                    lVar26 = local_f8._8_8_;
                    uVar96 = local_f8._0_8_;
                    local_f8._0_8_ = uVar96 << 0x10;
                    local_f8._8_8_ = lVar26 << 0x10 | uVar96 >> 0x30;
                    auVar97._8_8_ = local_190[uVar18][1] << 0x10 | uVar98 >> 0x30;
                    auVar97._0_8_ = uVar98 << 0x10 | (ulong)(ushort)ptr_01[uVar30];
                    lVar26 = local_138._8_8_;
                    uVar98 = local_138._0_8_;
                    local_138._0_8_ = uVar98 << 0x10;
                    local_138._8_8_ = lVar26 << 0x10 | uVar98 >> 0x30;
                    uVar98 = auVar100._0_8_;
                    auVar100._8_8_ = auVar100._8_8_ << 0x10 | uVar98 >> 0x30;
                    auVar100._0_8_ = uVar98 << 0x10 | (ulong)uVar8 & 0xffff;
                    uVar98 = local_108._0_8_;
                    local_108._8_8_ = local_108._8_8_ << 0x10 | uVar98 >> 0x30;
                    local_108._0_8_ = uVar98 << 0x10 | 1;
                    for (lVar26 = 0; size << 4 != lVar26; lVar26 = lVar26 + 0x10) {
                      auVar62 = paddsw(auVar97,*(undefined1 (*) [16])
                                                ((long)pvVar3 + lVar26 + lVar31));
                      psVar2 = (short *)((long)*ptr_02 + lVar26);
                      sVar48 = *psVar2;
                      sVar87 = psVar2[1];
                      sVar89 = psVar2[2];
                      sVar90 = psVar2[3];
                      sVar91 = psVar2[4];
                      sVar92 = psVar2[5];
                      sVar93 = psVar2[6];
                      sVar94 = psVar2[7];
                      sVar15 = auVar100._0_2_;
                      auVar52._0_2_ =
                           (ushort)(sVar48 < sVar15) * sVar15 | (ushort)(sVar48 >= sVar15) * sVar48;
                      sVar34 = auVar100._2_2_;
                      auVar52._2_2_ =
                           (ushort)(sVar87 < sVar34) * sVar34 | (ushort)(sVar87 >= sVar34) * sVar87;
                      sVar42 = auVar100._4_2_;
                      auVar52._4_2_ =
                           (ushort)(sVar89 < sVar42) * sVar42 | (ushort)(sVar89 >= sVar42) * sVar89;
                      sVar43 = auVar100._6_2_;
                      auVar52._6_2_ =
                           (ushort)(sVar90 < sVar43) * sVar43 | (ushort)(sVar90 >= sVar43) * sVar90;
                      sVar44 = auVar100._8_2_;
                      auVar52._8_2_ =
                           (ushort)(sVar91 < sVar44) * sVar44 | (ushort)(sVar91 >= sVar44) * sVar91;
                      sVar45 = auVar100._10_2_;
                      auVar52._10_2_ =
                           (ushort)(sVar92 < sVar45) * sVar45 | (ushort)(sVar92 >= sVar45) * sVar92;
                      sVar46 = auVar100._12_2_;
                      auVar52._12_2_ =
                           (ushort)(sVar93 < sVar46) * sVar46 | (ushort)(sVar93 >= sVar46) * sVar93;
                      sVar47 = auVar100._14_2_;
                      auVar52._14_2_ =
                           (ushort)(sVar94 < sVar47) * sVar47 | (ushort)(sVar94 >= sVar47) * sVar94;
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar26) = auVar52;
                      auVar66._0_2_ = -(ushort)(auVar62._0_2_ == auVar52._0_2_);
                      auVar66._2_2_ = -(ushort)(auVar62._2_2_ == auVar52._2_2_);
                      auVar66._4_2_ = -(ushort)(auVar62._4_2_ == auVar52._4_2_);
                      auVar66._6_2_ = -(ushort)(auVar62._6_2_ == auVar52._6_2_);
                      auVar66._8_2_ = -(ushort)(auVar62._8_2_ == auVar52._8_2_);
                      auVar66._10_2_ = -(ushort)(auVar62._10_2_ == auVar52._10_2_);
                      auVar66._12_2_ = -(ushort)(auVar62._12_2_ == auVar52._12_2_);
                      auVar66._14_2_ = -(ushort)(auVar62._14_2_ == auVar52._14_2_);
                      auVar40._0_2_ = -(ushort)(sVar15 < sVar48);
                      auVar40._2_2_ = -(ushort)(sVar34 < sVar87);
                      auVar40._4_2_ = -(ushort)(sVar42 < sVar89);
                      auVar40._6_2_ = -(ushort)(sVar43 < sVar90);
                      auVar40._8_2_ = -(ushort)(sVar44 < sVar91);
                      auVar40._10_2_ = -(ushort)(sVar45 < sVar92);
                      auVar40._12_2_ = -(ushort)(sVar46 < sVar93);
                      auVar40._14_2_ = -(ushort)(sVar47 < sVar94);
                      auVar40 = auVar40 | auVar66;
                      auVar109 = pblendvb(local_f8,*(undefined1 (*) [16])((long)*palVar22 + lVar26),
                                          auVar40);
                      *(undefined1 (*) [16])((long)*palVar22 + lVar26) = auVar109;
                      auVar50 = pblendvb(local_138,*(undefined1 (*) [16])((long)*ptr + lVar26),
                                         auVar40);
                      *(undefined1 (*) [16])((long)*ptr + lVar26) = auVar50;
                      auVar112 = pblendvb(local_108,*(undefined1 (*) [16])((long)*ptr_03 + lVar26),
                                          auVar40);
                      *(undefined1 (*) [16])((long)*ptr_03 + lVar26) = auVar112;
                      local_168._0_4_ =
                           CONCAT22(((short)auVar52._2_2_ < local_168._2_2_) * auVar52._2_2_ |
                                    (ushort)((short)auVar52._2_2_ >= local_168._2_2_) *
                                    local_168._2_2_,
                                    ((short)auVar52._0_2_ < (short)local_168) * auVar52._0_2_ |
                                    (ushort)((short)auVar52._0_2_ >= (short)local_168) *
                                    (short)local_168);
                      local_168._0_6_ =
                           CONCAT24(((short)auVar52._4_2_ < local_168._4_2_) * auVar52._4_2_ |
                                    (ushort)((short)auVar52._4_2_ >= local_168._4_2_) *
                                    local_168._4_2_,(undefined4)local_168);
                      local_168 = CONCAT26(((short)auVar52._6_2_ < local_168._6_2_) * auVar52._6_2_
                                           | (ushort)((short)auVar52._6_2_ >= local_168._6_2_) *
                                             local_168._6_2_,(undefined6)local_168);
                      uStack_160._0_4_ =
                           CONCAT22(((short)auVar52._10_2_ < uStack_160._2_2_) * auVar52._10_2_ |
                                    (ushort)((short)auVar52._10_2_ >= uStack_160._2_2_) *
                                    uStack_160._2_2_,
                                    ((short)auVar52._8_2_ < (short)uStack_160) * auVar52._8_2_ |
                                    (ushort)((short)auVar52._8_2_ >= (short)uStack_160) *
                                    (short)uStack_160);
                      uStack_160._0_6_ =
                           CONCAT24(((short)auVar52._12_2_ < uStack_160._4_2_) * auVar52._12_2_ |
                                    (ushort)((short)auVar52._12_2_ >= uStack_160._4_2_) *
                                    uStack_160._4_2_,(undefined4)uStack_160);
                      uStack_160 = CONCAT26(((short)auVar52._14_2_ < uStack_160._6_2_) *
                                            auVar52._14_2_ |
                                            (ushort)((short)auVar52._14_2_ >= uStack_160._6_2_) *
                                            uStack_160._6_2_,(undefined6)uStack_160);
                      uVar49 = ((short)uVar49 < (short)auVar52._0_2_) * auVar52._0_2_ |
                               ((short)uVar49 >= (short)auVar52._0_2_) * uVar49;
                      uVar55 = ((short)uVar55 < (short)auVar52._2_2_) * auVar52._2_2_ |
                               ((short)uVar55 >= (short)auVar52._2_2_) * uVar55;
                      uVar56 = ((short)uVar56 < (short)auVar52._4_2_) * auVar52._4_2_ |
                               ((short)uVar56 >= (short)auVar52._4_2_) * uVar56;
                      uVar57 = ((short)uVar57 < (short)auVar52._6_2_) * auVar52._6_2_ |
                               ((short)uVar57 >= (short)auVar52._6_2_) * uVar57;
                      uVar58 = ((short)uVar58 < (short)auVar52._8_2_) * auVar52._8_2_ |
                               ((short)uVar58 >= (short)auVar52._8_2_) * uVar58;
                      uVar59 = ((short)uVar59 < (short)auVar52._10_2_) * auVar52._10_2_ |
                               ((short)uVar59 >= (short)auVar52._10_2_) * uVar59;
                      uVar60 = ((short)uVar60 < (short)auVar52._12_2_) * auVar52._12_2_ |
                               ((short)uVar60 >= (short)auVar52._12_2_) * uVar60;
                      uVar61 = ((short)uVar61 < (short)auVar52._14_2_) * auVar52._14_2_ |
                               ((short)uVar61 >= (short)auVar52._14_2_) * uVar61;
                      sVar15 = auVar109._0_2_;
                      uVar49 = (ushort)((short)uVar49 < sVar15) * sVar15 |
                               ((short)uVar49 >= sVar15) * uVar49;
                      sVar15 = auVar109._2_2_;
                      uVar55 = (ushort)((short)uVar55 < sVar15) * sVar15 |
                               ((short)uVar55 >= sVar15) * uVar55;
                      sVar15 = auVar109._4_2_;
                      uVar56 = (ushort)((short)uVar56 < sVar15) * sVar15 |
                               ((short)uVar56 >= sVar15) * uVar56;
                      sVar15 = auVar109._6_2_;
                      uVar57 = (ushort)((short)uVar57 < sVar15) * sVar15 |
                               ((short)uVar57 >= sVar15) * uVar57;
                      sVar15 = auVar109._8_2_;
                      uVar58 = (ushort)((short)uVar58 < sVar15) * sVar15 |
                               ((short)uVar58 >= sVar15) * uVar58;
                      sVar15 = auVar109._10_2_;
                      uVar59 = (ushort)((short)uVar59 < sVar15) * sVar15 |
                               ((short)uVar59 >= sVar15) * uVar59;
                      sVar15 = auVar109._12_2_;
                      uVar60 = (ushort)((short)uVar60 < sVar15) * sVar15 |
                               ((short)uVar60 >= sVar15) * uVar60;
                      sVar15 = auVar109._14_2_;
                      uVar61 = (ushort)((short)uVar61 < sVar15) * sVar15 |
                               ((short)uVar61 >= sVar15) * uVar61;
                      sVar15 = auVar112._0_2_;
                      sVar34 = auVar50._0_2_;
                      uVar68 = (ushort)(sVar34 < sVar15) * sVar15 |
                               (ushort)(sVar34 >= sVar15) * sVar34;
                      sVar15 = auVar112._2_2_;
                      sVar34 = auVar50._2_2_;
                      uVar83 = (ushort)(sVar34 < sVar15) * sVar15 |
                               (ushort)(sVar34 >= sVar15) * sVar34;
                      sVar15 = auVar112._4_2_;
                      sVar34 = auVar50._4_2_;
                      uVar71 = (ushort)(sVar34 < sVar15) * sVar15 |
                               (ushort)(sVar34 >= sVar15) * sVar34;
                      sVar15 = auVar112._6_2_;
                      sVar34 = auVar50._6_2_;
                      uVar84 = (ushort)(sVar34 < sVar15) * sVar15 |
                               (ushort)(sVar34 >= sVar15) * sVar34;
                      sVar15 = auVar112._8_2_;
                      sVar34 = auVar50._8_2_;
                      uVar72 = (ushort)(sVar34 < sVar15) * sVar15 |
                               (ushort)(sVar34 >= sVar15) * sVar34;
                      sVar15 = auVar112._10_2_;
                      sVar34 = auVar50._10_2_;
                      uVar85 = (ushort)(sVar34 < sVar15) * sVar15 |
                               (ushort)(sVar34 >= sVar15) * sVar34;
                      sVar15 = auVar112._12_2_;
                      sVar34 = auVar50._12_2_;
                      sVar42 = auVar50._14_2_;
                      uVar86 = (ushort)(sVar34 < sVar15) * sVar15 |
                               (ushort)(sVar34 >= sVar15) * sVar34;
                      sVar15 = auVar112._14_2_;
                      uVar73 = (ushort)(sVar42 < sVar15) * sVar15 |
                               (ushort)(sVar42 >= sVar15) * sVar42;
                      uVar49 = ((short)uVar68 < (short)uVar49) * uVar49 |
                               ((short)uVar68 >= (short)uVar49) * uVar68;
                      uVar55 = ((short)uVar83 < (short)uVar55) * uVar55 |
                               ((short)uVar83 >= (short)uVar55) * uVar83;
                      uVar56 = ((short)uVar71 < (short)uVar56) * uVar56 |
                               ((short)uVar71 >= (short)uVar56) * uVar71;
                      uVar57 = ((short)uVar84 < (short)uVar57) * uVar57 |
                               ((short)uVar84 >= (short)uVar57) * uVar84;
                      uVar58 = ((short)uVar72 < (short)uVar58) * uVar58 |
                               ((short)uVar72 >= (short)uVar58) * uVar72;
                      uVar59 = ((short)uVar85 < (short)uVar59) * uVar59 |
                               ((short)uVar85 >= (short)uVar59) * uVar85;
                      uVar60 = ((short)uVar86 < (short)uVar60) * uVar60 |
                               ((short)uVar86 >= (short)uVar60) * uVar86;
                      uVar61 = ((short)uVar73 < (short)uVar61) * uVar61 |
                               ((short)uVar73 >= (short)uVar61) * uVar73;
                      auVar111._4_4_ = uVar35;
                      auVar111._0_4_ = uVar35;
                      auVar111._8_4_ = uVar35;
                      auVar111._12_4_ = uVar35;
                      auVar62 = psubsw(auVar52,auVar111);
                      auVar13._4_4_ = uVar36;
                      auVar13._0_4_ = uVar36;
                      auVar13._8_4_ = uVar36;
                      auVar13._12_4_ = uVar36;
                      auVar100 = psubsw(auVar100,auVar13);
                      auVar53._0_2_ = -(ushort)(auVar100._0_2_ < auVar62._0_2_);
                      auVar53._2_2_ = -(ushort)(auVar100._2_2_ < auVar62._2_2_);
                      auVar53._4_2_ = -(ushort)(auVar100._4_2_ < auVar62._4_2_);
                      auVar53._6_2_ = -(ushort)(auVar100._6_2_ < auVar62._6_2_);
                      auVar53._8_2_ = -(ushort)(auVar100._8_2_ < auVar62._8_2_);
                      auVar53._10_2_ = -(ushort)(auVar100._10_2_ < auVar62._10_2_);
                      auVar53._12_2_ = -(ushort)(auVar100._12_2_ < auVar62._12_2_);
                      auVar53._14_2_ = -(ushort)(auVar100._14_2_ < auVar62._14_2_);
                      if ((ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)((byte)(auVar53._14_2_ >> 7) & 1) << 0xe |
                                  auVar53._14_2_ & 0x8000) == 0xffff) goto LAB_0064dd88;
                      local_f8 = pblendvb(local_f8,auVar109,auVar53);
                      local_138 = pblendvb(local_138,auVar50,auVar53);
                      auVar62 = pmovsxbw(auVar53,0x101010101010101);
                      auVar109 = paddsw(local_108,auVar62);
                      auVar62 = paddsw(auVar112,auVar62);
                      local_108 = pblendvb(auVar109,auVar62,auVar53);
                      auVar97 = *(undefined1 (*) [16])((long)*local_190 + lVar26);
                    }
                  }
LAB_0064dd88:
                  uVar30 = uVar30 + 1;
                  palVar20 = local_190;
                  palVar21 = b;
                  palVar23 = b_00;
                  b = palVar22;
                  palVar22 = ptr;
                  b_00 = ptr_03;
                  ptr = ptr_04;
                  local_190 = ptr_02;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar25 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_striped_profile_sse41_128_16",pcVar25);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 2);
                vHM = _mm_slli_si128 (vHM, 2);
                vHS = _mm_slli_si128 (vHS, 2);
                vHL = _mm_slli_si128 (vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
            vHM = _mm_slli_si128 (vHM, 2);
            vHS = _mm_slli_si128 (vHS, 2);
            vHL = _mm_slli_si128 (vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}